

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O1

int __thiscall Arcflow::init(Arcflow *this,EVP_PKEY_CTX *ctx)

{
  NodeSet *this_00;
  Instance *this_01;
  int *__args;
  undefined4 uVar1;
  pointer piVar2;
  pointer pvVar3;
  iterator iVar4;
  pointer pAVar5;
  pointer pAVar6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  pointer pIVar10;
  int extraout_EAX;
  clock_t cVar11;
  runtime_error *prVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  pointer pvVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  vector<int,_std::allocator<int>_> *pvVar21;
  long lVar22;
  uint uVar23;
  vector<int,_std::allocator<int>_> max_state;
  char _error_msg_ [256];
  allocator_type local_169;
  vector<Item,_std::allocator<Item>_> local_168;
  vector<int,_std::allocator<int>_> *local_150;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  *local_148;
  value_type local_13c;
  vector<Item,_std::allocator<Item>_> local_138 [11];
  
  if (this->ready != false) {
    snprintf((char *)local_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x1f);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,(char *)local_138);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = &this->inst;
  (this->inst).n = *(int *)(ctx + 0x10);
  uVar8 = *(undefined8 *)ctx;
  uVar9 = *(undefined8 *)(ctx + 8);
  (this->inst).ndims = (int)uVar8;
  (this->inst).nbtypes = (int)((ulong)uVar8 >> 0x20);
  (this->inst).nsizes = (int)uVar9;
  (this->inst).m = (int)((ulong)uVar9 >> 0x20);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=(&(this->inst).Ws,
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)(ctx + 0x18));
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->inst).Cs,(vector<int,_std::allocator<int>_> *)(ctx + 0x30));
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->inst).Qs,(vector<int,_std::allocator<int>_> *)(ctx + 0x48));
  std::vector<Item,_std::allocator<Item>_>::operator=
            (&(this->inst).items,(vector<Item,_std::allocator<Item>_> *)(ctx + 0x60));
  uVar1 = *(undefined4 *)(ctx + 0x7b);
  (this->inst).method = *(int *)(ctx + 0x78);
  *(undefined4 *)((long)&(this->inst).method + 3) = uVar1;
  std::vector<char,_std::allocator<char>_>::operator=
            (&(this->inst).ctypes,(vector<char,_std::allocator<char>_> *)(ctx + 0x80));
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->inst).nopts,(vector<int,_std::allocator<int>_> *)(ctx + 0x98));
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->inst).demands,(vector<int,_std::allocator<int>_> *)(ctx + 0xb0));
  iVar13 = (this->inst).ndims;
  this->LOSS = (this->inst).nsizes;
  this->label_size = iVar13;
  Instance::sorted_items(&local_168,this_01);
  local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_start = (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_finish = (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_start = local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Item,_std::allocator<Item>_>::~vector(local_138);
  std::vector<Item,_std::allocator<Item>_>::~vector(&local_168);
  pvVar21 = &this->maxW;
  local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                              super__Vector_impl_data._M_start & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::resize
            (pvVar21,(long)this->label_size,(value_type *)local_138);
  if (0 < (this->inst).ndims) {
    piVar2 = (this->maxW).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar3 = (this->inst).Ws.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar14 = 0;
    do {
      if (0 < (this->inst).nbtypes) {
        lVar17 = 0;
        pvVar16 = pvVar3;
        do {
          iVar13 = piVar2[lVar14];
          iVar18 = *(int *)(*(long *)&(pvVar16->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data + lVar14 * 4);
          if (iVar18 < iVar13) {
            iVar18 = iVar13;
          }
          piVar2[lVar14] = iVar18;
          lVar17 = lVar17 + 1;
          pvVar16 = pvVar16 + 1;
        } while (lVar17 < (this->inst).nbtypes);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < this_01->ndims);
  }
  std::vector<int,_std::allocator<int>_>::operator=(&this->max_label,pvVar21);
  if ((this->inst).binary != false) {
    this->label_size = (this->inst).ndims + 1;
    local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(local_138[0].super__Vector_base<Item,_std::allocator<Item>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x7fffffff);
    iVar4._M_current =
         (this->max_label).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (this->max_label).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->max_label,iVar4,(int *)local_138);
    }
    else {
      *iVar4._M_current = 0x7fffffff;
      (this->max_label).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
  }
  __args = &(this->inst).nsizes;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_168,pvVar21);
  if (local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_168,
               (iterator)
               local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
               super__Vector_impl_data._M_finish,__args);
  }
  else {
    *(int *)local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
            super__Vector_impl_data._M_finish = *__args;
    local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((long)local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                                super__Vector_impl_data._M_finish + 4);
  }
  if ((this->inst).binary == false) {
    local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((ulong)local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl
                                .super__Vector_impl_data._M_start & 0xffffffff00000000);
    pIVar10 = local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (0 < (long)*__args) {
      local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      lVar14 = 0;
      iVar13 = (int)local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
      _M_start = pIVar10;
      do {
        iVar18 = *(int *)((long)&((this->sitems).super__Vector_base<Item,_std::allocator<Item>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->demand + lVar14);
        if (iVar13 <= iVar18) {
          iVar13 = iVar18;
        }
        local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)CONCAT44(local_138[0].super__Vector_base<Item,_std::allocator<Item>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,iVar13);
        lVar14 = lVar14 + 0x48;
      } while ((long)*__args * 0x48 != lVar14);
    }
    if (local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_168,
                 (iterator)
                 local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)local_138);
    }
    else {
      *(int *)local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
              super__Vector_impl_data._M_finish =
           (int)local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)((long)local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                                  super__Vector_impl_data._M_finish + 4);
    }
  }
  local_148 = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
               *)&this->weights;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_148,(long)(this->inst).nsizes);
  local_150 = pvVar21;
  if (0 < *__args) {
    lVar14 = 0;
    lVar22 = 0;
    lVar17 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)
                 ((long)&(((this->weights).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data + lVar14),
                 (vector<int,_std::allocator<int>_> *)
                 ((long)&(((this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                           super__Vector_impl_data._M_start)->w).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar22));
      lVar17 = lVar17 + 1;
      lVar22 = lVar22 + 0x48;
      lVar14 = lVar14 + 0x18;
    } while (lVar17 < *__args);
  }
  local_13c = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_138,(long)this_01->ndims,&local_13c,
             &local_169);
  std::
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  ::emplace_back<std::vector<int,std::allocator<int>>>
            (local_148,(vector<int,_std::allocator<int>_> *)local_138);
  pvVar21 = local_150;
  if (local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  count_max_rep((vector<int,_std::allocator<int>_> *)local_138,this,pvVar21,0,0);
  piVar2 = (this->max_rep).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->max_rep).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                      super__Vector_impl_data._M_start;
  (this->max_rep).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                       super__Vector_impl_data._M_finish;
  (this->max_rep).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  if (local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (0 < (int)((ulong)((long)local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2)) {
    lVar14 = 0;
    do {
      pIVar10 = local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)local_138[0].super__Vector_base<Item,_std::allocator<Item>_>.
                                  _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      uVar15 = *(uint *)((long)&((local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                                  super__Vector_impl_data._M_start)->w).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar14 * 4);
      if (uVar15 != 0) {
        iVar13 = 0;
        do {
          iVar13 = iVar13 + 1;
          bVar7 = 1 < uVar15;
          uVar15 = (int)uVar15 >> 1;
        } while (bVar7);
        local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data
        ._M_start._4_4_ = SUB84(pIVar10,4);
        local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)CONCAT44(local_138[0].super__Vector_base<Item,_std::allocator<Item>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,iVar13);
      }
      iVar4._M_current =
           (this->hash_bits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->hash_bits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->hash_bits,iVar4,(int *)local_138);
      }
      else {
        *iVar4._M_current =
             (int)local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (this->hash_bits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (int)((ulong)((long)local_168.super__Vector_base<Item,_std::allocator<Item>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_168.super__Vector_base<Item,_std::allocator<Item>_>.
                                         _M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  printf("Build (method = %d)\n",(ulong)(uint)(this->inst).method);
  if ((this->inst).method == -3) {
    build(this);
    this_00 = &this->NS;
    iVar13 = NodeSet::size(this_00);
    uVar15 = iVar13 + (this->inst).nbtypes;
    pAVar5 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data
             ._M_start;
    pAVar6 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data
             ._M_finish;
    iVar13 = NodeSet::size(this_00);
    uVar20 = (int)((ulong)((long)pAVar6 - (long)pAVar5) >> 2) * -0x55555555 +
             (iVar13 + -1) * (this->inst).nbtypes + 1;
    cVar11 = clock();
    printf("  Step-3\' Graph: %d vertices and %d arcs (%.2fs)\n",
           SUB84((double)(cVar11 - this->tstart) / 1000000.0,0),(ulong)uVar15,(ulong)uVar20);
    final_compression_step(this);
    finalize(this);
    iVar13 = NodeSet::size(this_00);
    uVar23 = iVar13 + (int)((ulong)((long)(this->Ts).super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->Ts).super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start) >> 2);
    uVar19 = (int)((ulong)((long)(this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2) * -0x55555555;
    cVar11 = clock();
    printf("  Step-4\' Graph: %d vertices and %d arcs (%.2fs)\n",
           SUB84((double)(cVar11 - this->tstart) / 1000000.0,0),(ulong)uVar23,(ulong)uVar19);
    printf("  #V4/#V3 = %.2f\n",SUB84((double)(int)uVar23 / (double)(int)uVar15,0));
    printf("  #A4/#A3 = %.2f\n",SUB84((double)(int)uVar19 / (double)(int)uVar20,0));
    cVar11 = clock();
    iVar13 = printf("Ready! (%.2fs)\n",SUB84((double)(cVar11 - this->tstart) / 1000000.0,0));
    if (this->ready != false) {
      if (local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                        super__Vector_impl_data._M_start);
        iVar13 = extraout_EAX;
      }
      return iVar13;
    }
    snprintf((char *)local_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == true",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x5e);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,(char *)local_138);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  snprintf((char *)local_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
           "inst.method >= MIN_METHOD && inst.method <= MAX_METHOD",
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
           ,0x4d);
  prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar12,(char *)local_138);
  __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Arcflow::init(const Instance &_inst) {
	throw_assert(ready == false);
	inst = _inst;
	LOSS = inst.nsizes;
	label_size = inst.ndims;
	sitems = inst.sorted_items();
	maxW.resize(label_size, 0);
	for (int d = 0; d < inst.ndims; d++) {
		for (int t = 0; t < inst.nbtypes; t++) {
			maxW[d] = std::max(maxW[d], inst.Ws[t][d]);
		}
	}

	max_label = maxW;
	if (inst.binary) {
		label_size = inst.ndims + 1;
		max_label.push_back(INT_MAX);
	}

	std::vector<int> max_state = maxW;
	max_state.push_back(inst.nsizes);
	if (!inst.binary) {
		int maxb = 0;
		for (int it = 0; it < inst.nsizes; it++) {
			maxb = std::max(maxb, sitems[it].demand);
		}
		max_state.push_back(maxb);
	}

	weights.resize(inst.nsizes);
	for (int i = 0; i < inst.nsizes; i++) {
		weights[i] = sitems[i].w;
	}
	weights.push_back(std::vector<int>(inst.ndims, 0));  // loss arcs

	max_rep = count_max_rep(maxW, 0, 0);

	for (int i = 0; i < static_cast<int>(max_state.size()); i++) {
		int nbits = 0, value = max_state[i];
		while (value) {
			nbits++;
			value >>= 1;
		}
		hash_bits.push_back(nbits);
	}

	printf("Build (method = %d)\n", inst.method);
	throw_assert(inst.method >= MIN_METHOD && inst.method <= MAX_METHOD);

	build();  // build step-3' graph
	int nv1 = NS.size() + inst.nbtypes;
	int na1 = A.size() + (NS.size() - 1) * inst.nbtypes + 1;
	printf("  Step-3' Graph: %d vertices and %d arcs (%.2fs)\n",
		   nv1, na1, TIMEDIF(tstart));

	final_compression_step();  // create step-4' graph
	finalize();  // add the final loss arcs
	int nv2 = NS.size() + Ts.size();
	int na2 = A.size();
	printf("  Step-4' Graph: %d vertices and %d arcs (%.2fs)\n",
		   nv2, na2, TIMEDIF(tstart));
	printf("  #V4/#V3 = %.2f\n", nv2 / static_cast<double>(nv1));
	printf("  #A4/#A3 = %.2f\n", na2 / static_cast<double>(na1));
	printf("Ready! (%.2fs)\n", TIMEDIF(tstart));
	throw_assert(ready == true);
}